

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpRequest.h
# Opt level: O0

string * __thiscall
sing::HttpRequest::getHeaders(string *__return_storage_ptr__,HttpRequest *this,string *field)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_48 [3];
  _Self local_30;
  const_iterator it;
  string *field_local;
  HttpRequest *this_local;
  string *result;
  
  it._M_node._7_1_ = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&this->headers,field);
  local_48[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->headers);
  bVar1 = std::operator!=(&local_30,local_48);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_30);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&ppVar2->second);
  }
  return __return_storage_ptr__;
}

Assistant:

string getHeaders(const string& field) const{
        string result;
        auto it = headers.find(field);
        if(it!=headers.end()){
            result = it->second;
        }
        return result;
    }